

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

void Abc_RestructNodeDivisors(Abc_ManRst_t *p,Abc_Obj_t *pRoot,int nNodesSaved)

{
  long *Entry;
  long lVar1;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  
  p->vDecs->nSize = 0;
  iVar4 = 0;
  while( true ) {
    if (p->vLeaves->nSize <= iVar4) {
      iVar4 = 0;
      while( true ) {
        p_00 = p->vDecs;
        iVar6 = p_00->nSize;
        if (iVar6 <= iVar4) break;
        plVar3 = (long *)Vec_PtrEntry(p_00,iVar4);
        for (lVar5 = 0; lVar5 < *(int *)((long)plVar3 + 0x2c); lVar5 = lVar5 + 1) {
          Entry = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                            (long)*(int *)(plVar3[6] + lVar5 * 4) * 8);
          if ((*(uint *)((long)Entry + 0x14) & 0xf) != 3 &&
              (char)((*(uint *)((long)Entry + 0x14) & 0x40) >> 6) == '\0') {
            lVar1 = *(long *)(*(long *)(*Entry + 0x20) + 8);
            if (((*(byte *)(*(long *)(lVar1 + (long)*(int *)Entry[4] * 8) + 0x14) & 0x40) != 0) &&
               ((*(byte *)(*(long *)(lVar1 + (long)((int *)Entry[4])[1] * 8) + 0x14) & 0x40) != 0))
            {
              Vec_PtrPush(p->vDecs,Entry);
              *(byte *)((long)Entry + 0x14) = *(byte *)((long)Entry + 0x14) | 0x40;
            }
          }
        }
        iVar4 = iVar4 + 1;
      }
      for (iVar4 = 0; iVar4 < iVar6; iVar4 = iVar4 + 1) {
        pvVar2 = Vec_PtrEntry(p_00,iVar4);
        *(byte *)((long)pvVar2 + 0x14) = *(byte *)((long)pvVar2 + 0x14) & 0xbf;
        p_00 = p->vDecs;
        iVar6 = p_00->nSize;
      }
      printf("%d\n",(ulong)(uint)(iVar6 - (nNodesSaved + p->vLeaves->nSize)));
      return;
    }
    pvVar2 = Vec_PtrEntry(p->vLeaves,iVar4);
    Vec_PtrPush(p->vDecs,pvVar2);
    if ((*(uint *)((long)pvVar2 + 0x14) & 0x40) != 0) break;
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) | 0x40;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("pNode->fMarkC == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                ,0xe2,"void Abc_RestructNodeDivisors(Abc_ManRst_t *, Abc_Obj_t *, int)");
}

Assistant:

void Abc_RestructNodeDivisors( Abc_ManRst_t * p, Abc_Obj_t * pRoot, int nNodesSaved )
{
    Abc_Obj_t * pNode, * pFanout;//, * pFanin;
    int i, k;
    // start with the leaves
    Vec_PtrClear( p->vDecs );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pNode, i )
    {
        Vec_PtrPush( p->vDecs, pNode );
        assert( pNode->fMarkC == 0 );
        pNode->fMarkC = 1;
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( pFanout->fMarkC || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_ObjFanin0(pFanout)->fMarkC && Abc_ObjFanin1(pFanout)->fMarkC )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                pFanout->fMarkC = 1;
            }
        }
    }
    // unmark the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
        pNode->fMarkC = 0;
/*
    // print the nodes
    Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDecs, pNode, i, Vec_PtrSize(p->vLeaves) )
    {
        printf( "%2d %s = ", i, Abc_NodeIsTravIdCurrent(pNode)? "*" : " " );
        // find the first fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pFanin, k )
            if ( Abc_ObjFanin0(pNode) == pFanin )
                break;
        if ( k < Vec_PtrSize(p->vLeaves) )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC0(pNode)? "\'" : "" );
        // find the second fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pFanin, k )
            if ( Abc_ObjFanin1(pNode) == pFanin )
                break;
        if ( k < Vec_PtrSize(p->vLeaves) )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC1(pNode)? "\'" : "" );
        printf( "\n" );
    }
*/
    printf( "%d\n", Vec_PtrSize(p->vDecs)-nNodesSaved-Vec_PtrSize(p->vLeaves) );
}